

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O2

void mocker::anon_unknown_0::genCall
               (Section *text,FuncSelectionContext *ctx,shared_ptr<mocker::ir::Call> *p)

{
  pointer psVar1;
  int iVar2;
  shared_ptr<mocker::nasm::Register> *psVar3;
  ulong uVar4;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  element_type *peVar7;
  size_t i;
  ulong uVar8;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  allocator<char> local_b9;
  shared_ptr<mocker::ir::Call> *local_b8;
  shared_ptr<mocker::nasm::Register> tmp;
  shared_ptr<mocker::nasm::Register> rspCopy;
  shared_ptr<mocker::nasm::Addr> retVal;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_b8 = p;
  if ((anonymous_namespace)::
      genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
      ::ParamRegs == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
                                 ::ParamRegs);
    if (iVar2 != 0) {
      p_Var5 = &nasm::rdi()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)&retVal,p_Var5)
      ;
      p_Var5 = &nasm::rsi()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,p_Var5);
      p_Var5 = &nasm::rdx()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,p_Var5);
      p_Var5 = &nasm::rcx()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,p_Var5);
      p_Var5 = &nasm::r8()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,p_Var5);
      p_Var5 = &nasm::r9()->super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,p_Var5);
      __l._M_len = 6;
      __l._M_array = (iterator)&retVal;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::vector(&genCall::ParamRegs,__l,(allocator_type *)&rspCopy);
      lVar6 = 0x58;
      do {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&retVal.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar6));
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != -8);
      __cxa_atexit(std::
                   vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ::~vector,&genCall::ParamRegs,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
                           ::ParamRegs);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&retVal,"",(allocator<char> *)&tmp);
  FuncSelectionContext::newVirtualReg((FuncSelectionContext *)&rspCopy,(string *)ctx);
  std::__cxx11::string::~string((string *)&retVal);
  psVar3 = nasm::rsp();
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
            (text,&rspCopy,psVar3);
  lVar6 = 0;
  for (uVar8 = 0;
      psVar1 = genCall::ParamRegs.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      peVar7 = (local_b8->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      uVar8 != 6; uVar8 = uVar8 + 1) {
    uVar4 = (long)(peVar7->args).
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(peVar7->args).
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)uVar4 >> 4) <= uVar8) goto LAB_00118120;
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)&retVal,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>>
              (text,(shared_ptr<mocker::nasm::Register> *)
                    ((long)&(psVar1->
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + lVar6),&retVal);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&retVal.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar6 = lVar6 + 0x10;
  }
  uVar4 = (long)(peVar7->args).
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar7->args).
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_00118120:
  uVar8 = uVar4 >> 4 & 0xffffffff;
  while (uVar8 = uVar8 - 1, 5 < (int)uVar8) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&retVal,"",&local_b9);
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)&tmp,(string *)ctx);
    std::__cxx11::string::~string((string *)&retVal);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)&retVal,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
              (text,&tmp,&retVal);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&retVal.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    nasm::Section::emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>&>
              (text,&tmp);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tmp.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  renameIdentifier((string *)&retVal,
                   &((local_b8->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->funcName);
  nasm::Section::emplaceInst<mocker::nasm::Call,std::__cxx11::string>
            (text,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&retVal);
  std::__cxx11::string::~string((string *)&retVal);
  peVar7 = (local_b8->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar7->super_Definition).dest.
      super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              ((__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> *)&tmp,
               &(peVar7->super_Definition).dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)&retVal,(shared_ptr<mocker::ir::Addr> *)ctx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tmp.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    psVar3 = nasm::rax();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
              (text,&retVal,psVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&retVal.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar7 = (local_b8->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (0x60 < (ulong)((long)(peVar7->args).
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar7->args).
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    psVar3 = nasm::rsp();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
              (text,psVar3,&rspCopy);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rspCopy.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void genCall(nasm::Section &text, FuncSelectionContext &ctx,
             const std::shared_ptr<ir::Call> &p) {
  static const std::vector<std::shared_ptr<nasm::Register>> ParamRegs = {
      nasm::rdi(), nasm::rsi(), nasm::rdx(),
      nasm::rcx(), nasm::r8(),  nasm::r9()};
  auto rspCopy = ctx.newVirtualReg();
  text.emplaceInst<nasm::Mov>(rspCopy, nasm::rsp());

  for (std::size_t i = 0; i < 6 && i < p->getArgs().size(); ++i) {
    text.emplaceInst<nasm::Mov>(ParamRegs[i], ctx.getIrAddr(p->getArgs()[i]));
  }
  for (int i = p->getArgs().size() - 1; i >= 6; --i) {
    auto tmp = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(tmp, ctx.getIrAddr(p->getArgs()[i]));
    text.emplaceInst<nasm::Push>(tmp);
  }

  text.emplaceInst<nasm::Call>(renameIdentifier(p->getFuncName()));
  if (p->getDest()) {
    auto retVal = ctx.getIrAddr(p->getDest());
    text.emplaceInst<nasm::Mov>(retVal, nasm::rax());
  }

  if (p->getArgs().size() > 6) {
    text.emplaceInst<nasm::Mov>(nasm::rsp(), rspCopy);
  }
}